

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::Block::finalize(Block *this)

{
  bool bVar1;
  size_t sVar2;
  Expression **ppEVar3;
  Type TVar4;
  Block *local_160;
  Expression *temp;
  char *pcStack_150;
  undefined1 local_140 [8];
  BranchSeeker seeker;
  Block *this_local;
  
  sVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                    (&(this->list).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  if (sVar2 == 0) {
    wasm::Type::Type((Type *)&seeker.types._M_h._M_single_bucket,none);
    (this->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id =
         (uintptr_t)seeker.types._M_h._M_single_bucket;
  }
  else {
    ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                        (&(this->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    (this->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id =
         ((*ppEVar3)->type).id;
    bVar1 = IString::is(&(this->name).super_IString);
    if (bVar1) {
      temp = (Expression *)(this->name).super_IString.str._M_len;
      pcStack_150 = (this->name).super_IString.str._M_str;
      BranchUtils::BranchSeeker::BranchSeeker
                ((BranchSeeker *)local_140,(Name)(this->name).super_IString.str);
      local_160 = this;
      Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
      ::walk((Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
              *)local_140,(Expression **)&local_160);
      if ((int)seeker.target.super_IString.str._M_str == 0) {
        handleUnreachable(this,NoBreak);
      }
      else {
        std::
        unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
        ::insert((unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
                  *)&seeker.found,
                 &(this->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type);
        TVar4 = wasm::Type::
                getLeastUpperBound<std::unordered_set<wasm::Type,std::hash<wasm::Type>,std::equal_to<wasm::Type>,std::allocator<wasm::Type>>>
                          ((unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
                            *)&seeker.found);
        (this->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id =
             TVar4.id;
      }
      BranchUtils::BranchSeeker::~BranchSeeker((BranchSeeker *)local_140);
    }
    else {
      handleUnreachable(this,NoBreak);
    }
  }
  return;
}

Assistant:

void Block::finalize() {
  if (list.size() == 0) {
    type = Type::none;
    return;
  }
  // The default type is what is at the end. Next we need to see if breaks and/
  // or unreachability change that.
  type = list.back()->type;
  if (!name.is()) {
    // Nothing branches here, so this is easy.
    handleUnreachable(this, NoBreak);
    return;
  }

  // The default type is according to the value that flows out.
  BranchUtils::BranchSeeker seeker(this->name);
  Expression* temp = this;
  seeker.walk(temp);
  if (seeker.found) {
    // Calculate the supertype of the branch types and the flowed-out type. If
    // there is no supertype among the available types, assume the current type
    // is already correct. TODO: calculate proper LUBs to compute a new correct
    // type in this situation.
    seeker.types.insert(type);
    type = Type::getLeastUpperBound(seeker.types);
  } else {
    // There are no branches, so this block may be unreachable.
    handleUnreachable(this, NoBreak);
  }
}